

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::DropInfo::Deserialize(DropInfo *this,Deserializer *deserializer)

{
  CatalogType CVar1;
  OnEntryNotFound OVar2;
  undefined1 uVar3;
  uint uVar4;
  DropInfo *this_00;
  pointer pDVar6;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ExtraDropInfo_*,_false> _Var7;
  _Head_base<0UL,_duckdb::ExtraDropInfo_*,_false> _Var8;
  string str;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> local_58;
  ExtraDropInfo local_50;
  ExtraDropInfo local_40;
  int iVar5;
  
  this_00 = (DropInfo *)operator_new(0x80);
  DropInfo(this_00);
  local_58._M_head_impl = this_00;
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    CVar1 = EnumUtil::FromString<duckdb::CatalogType>((char *)local_50._vptr_ExtraDropInfo);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) {
      operator_delete(local_50._vptr_ExtraDropInfo);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    CVar1 = (CatalogType)iVar5;
  }
  (pDVar6->super_ParseInfo).field_0x9 = CVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"catalog");
  if ((char)uVar4 == '\0') {
    local_50.info_type = INVALID;
    local_50._9_7_ = 0;
    local_40._vptr_ExtraDropInfo._0_1_ = 0;
    local_50._vptr_ExtraDropInfo = (_func_int **)&local_40;
    ::std::__cxx11::string::operator=((string *)&pDVar6->catalog,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) goto LAB_010a4c1b;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pDVar6->catalog,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) {
LAB_010a4c1b:
      operator_delete(local_50._vptr_ExtraDropInfo);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"schema");
  if ((char)uVar4 == '\0') {
    local_50.info_type = INVALID;
    local_50._9_7_ = 0;
    local_40._vptr_ExtraDropInfo._0_1_ = 0;
    local_50._vptr_ExtraDropInfo = (_func_int **)&local_40;
    ::std::__cxx11::string::operator=((string *)&pDVar6->schema,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) goto LAB_010a4cb7;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pDVar6->schema,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) {
LAB_010a4cb7:
      operator_delete(local_50._vptr_ExtraDropInfo);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"name");
  if ((char)uVar4 == '\0') {
    local_50.info_type = INVALID;
    local_50._9_7_ = 0;
    local_40._vptr_ExtraDropInfo._0_1_ = 0;
    local_50._vptr_ExtraDropInfo = (_func_int **)&local_40;
    ::std::__cxx11::string::operator=((string *)&pDVar6->name,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo == &local_40) goto LAB_010a4d58;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pDVar6->name,(string *)&local_50);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo == &local_40) goto LAB_010a4d58;
  }
  operator_delete(local_50._vptr_ExtraDropInfo);
LAB_010a4d58:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"if_not_found");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    OVar2 = EnumUtil::FromString<duckdb::OnEntryNotFound>((char *)local_50._vptr_ExtraDropInfo);
    if ((ExtraDropInfo *)local_50._vptr_ExtraDropInfo != &local_40) {
      operator_delete(local_50._vptr_ExtraDropInfo);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar2 = (OnEntryNotFound)iVar5;
  }
  pDVar6->if_not_found = OVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"cascade");
  if ((char)uVar4 == '\0') {
    uVar3 = false;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (undefined1)iVar5;
  }
  pDVar6->cascade = (bool)uVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xce,"allow_drop_internal");
  if ((char)uVar4 == '\0') {
    uVar3 = false;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (undefined1)iVar5;
  }
  pDVar6->allow_drop_internal = (bool)uVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pDVar6 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcf,"extra_drop_info");
  if ((char)uVar4 == '\0') {
    _Var7._M_head_impl =
         (pDVar6->extra_drop_info).
         super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>
         .super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl;
    (pDVar6->extra_drop_info).
    super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
    super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl = (ExtraDropInfo *)0x0;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var8._M_head_impl = (ExtraDropInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ExtraDropInfo::Deserialize(&local_50,deserializer);
      _Var8._M_head_impl = (ExtraDropInfo *)local_50._vptr_ExtraDropInfo;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var7._M_head_impl =
         (pDVar6->extra_drop_info).
         super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>
         .super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl;
    (pDVar6->extra_drop_info).
    super_unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
    super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl = _Var8._M_head_impl;
  }
  if (_Var7._M_head_impl != (ExtraDropInfo *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_ExtraDropInfo[1])();
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> DropInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DropInfo>(new DropInfo());
	deserializer.ReadProperty<CatalogType>(200, "type", result->type);
	deserializer.ReadPropertyWithDefault<string>(201, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<string>(202, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(203, "name", result->name);
	deserializer.ReadProperty<OnEntryNotFound>(204, "if_not_found", result->if_not_found);
	deserializer.ReadPropertyWithDefault<bool>(205, "cascade", result->cascade);
	deserializer.ReadPropertyWithDefault<bool>(206, "allow_drop_internal", result->allow_drop_internal);
	deserializer.ReadPropertyWithDefault<unique_ptr<ExtraDropInfo>>(207, "extra_drop_info", result->extra_drop_info);
	return std::move(result);
}